

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inputparser.cpp
# Opt level: O1

void __thiscall PropertyParser::parseNodeProperty(PropertyParser *this,int type,string *nodeName)

{
  pointer pcVar1;
  Node *node;
  InputError *this_00;
  string local_48;
  
  node = Network::node((this->super_InputParser).network,nodeName);
  if (node != (Node *)0x0) {
    switch(type) {
    case 0xb:
      NodeParser::parseEmitter
                ((NodeParser *)&this->field_0x10,node,(this->super_InputParser).network,
                 &this->tokens);
      return;
    case 0xc:
      NodeParser::parseDemand
                ((NodeParser *)&this->field_0x10,node,(this->super_InputParser).network,
                 &this->tokens);
      return;
    default:
      return;
    case 0x11:
      NodeParser::parseInitQual((NodeParser *)&this->field_0x10,node,&this->tokens);
      return;
    case 0x12:
      NodeParser::parseQualSource
                ((NodeParser *)&this->field_0x10,node,(this->super_InputParser).network,
                 &this->tokens);
      return;
    case 0x13:
      NodeParser::parseTankReact((NodeParser *)&this->field_0x10,node,&this->tokens);
      return;
    case 0x14:
      NodeParser::parseTankMixing((NodeParser *)&this->field_0x10,node,&this->tokens);
      return;
    case 0x18:
      NodeParser::parseCoords((NodeParser *)&this->field_0x10,node,&this->tokens);
      return;
    }
  }
  this_00 = (InputError *)__cxa_allocate_exception(0x30);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  pcVar1 = (nodeName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + nodeName->_M_string_length);
  InputError::InputError(this_00,5,&local_48);
  __cxa_throw(this_00,&InputError::typeinfo,ENerror::~ENerror);
}

Assistant:

void PropertyParser::parseNodeProperty(int type, string& nodeName)
{
    Node* node = network->node(nodeName);
    if ( node == nullptr ) throw InputError(InputError::UNDEFINED_OBJECT, nodeName);
    switch (type)
    {
        case InputReader::EMITTER:
            nodeParser.parseEmitter(node, network, tokens);
            break;
        case InputReader::DEMAND:
            nodeParser.parseDemand(node, network, tokens);
            break;
        case InputReader::COORD:
            nodeParser.parseCoords(node, tokens);
            break;
        case InputReader::QUALITY:
            nodeParser.parseInitQual(node, tokens);
            break;
        case InputReader::SOURCE:
            nodeParser.parseQualSource(node, network, tokens);
            break;
        case InputReader::MIXING:
            nodeParser.parseTankMixing(node, tokens);
            break;
        case InputReader::REACTION:
            nodeParser.parseTankReact(node, tokens);
            break;
    }
}